

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void CLI::detail::checkParentSegments
               (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *output,
               string *currentSection,char parentSeparator)

{
  bool bVar1;
  unsigned_long *puVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  size_type sVar3;
  reference pvVar4;
  size_t ii_2;
  string *in_stack_00000090;
  string *in_stack_00000098;
  size_t ii_1;
  size_t ii;
  size_t mpair;
  size_t common;
  size_t msize;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parents;
  string estring;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  reference in_stack_fffffffffffffec8;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *in_stack_fffffffffffffed0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffed8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffee0;
  size_type local_f8;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *local_c0;
  ulong local_98;
  size_type local_90;
  unsigned_long local_88;
  size_type local_80;
  ulong local_78;
  ulong local_70;
  size_type local_68;
  undefined1 local_50 [80];
  
  ::std::__cxx11::string::string((string *)(local_50 + 0x18));
  generate_parents(in_stack_00000098,in_stack_00000090,ii_2._7_1_);
  bVar1 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::empty
                    (in_stack_fffffffffffffed0);
  if (!bVar1) {
    std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
              ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
               in_stack_fffffffffffffec0);
    bVar1 = ::std::operator==(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
    if (bVar1) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_50);
      if (sVar3 < 2) {
        local_f8 = 2;
      }
      else {
        local_f8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_50);
      }
      local_68 = local_f8;
      while( true ) {
        pvVar4 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                           ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                            in_stack_fffffffffffffec0);
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&pvVar4->parents);
        if (sVar3 < local_68) break;
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                  ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                   in_stack_fffffffffffffec0);
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                  ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                   in_stack_fffffffffffffec0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x1836f3);
      }
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_50);
      if (1 < sVar3) {
        local_70 = 0;
        pvVar4 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                           ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                            in_stack_fffffffffffffec0);
        local_80 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&pvVar4->parents);
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_50);
        local_88 = sVar3 - 1;
        puVar2 = std::min<unsigned_long>(&local_80,&local_88);
        local_78 = *puVar2;
        for (local_90 = 0; local_90 < local_78; local_90 = local_90 + 1) {
          pvVar4 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                             ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                              in_stack_fffffffffffffec0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&pvVar4->parents,local_90);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_50,local_90);
          bVar1 = ::std::operator!=(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
          if (bVar1) break;
          local_70 = local_70 + 1;
        }
        if (local_70 == local_78) {
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::pop_back
                    ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)0x183863);
        }
        else {
          while( true ) {
            pvVar4 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                               ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                                in_stack_fffffffffffffec0);
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&pvVar4->parents);
            if (sVar3 <= local_70 + 1) break;
            std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                      ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                       in_stack_fffffffffffffec0);
            std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                      (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
            std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                      ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                       in_stack_fffffffffffffec0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x1838c3);
          }
        }
        for (local_98 = local_70;
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_50), local_98 < sVar3 - 1; local_98 = local_98 + 1) {
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                    ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                     in_stack_fffffffffffffec0);
          __first._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                         (in_stack_fffffffffffffec0);
          __last._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffeb8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffeb8);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator+((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffec8,(difference_type)in_stack_fffffffffffffec0);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator+((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffec8,(difference_type)in_stack_fffffffffffffec0);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          assign<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffed0,__first,__last);
          pvVar4 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                             ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                              in_stack_fffffffffffffec0);
          ::std::__cxx11::string::operator=((string *)&pvVar4->name,"++");
        }
      }
      goto LAB_00183b0b;
    }
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_50);
  if (1 < sVar3) {
    local_c0 = (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)0x0;
    while (in_stack_fffffffffffffed0 = local_c0,
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_50),
          in_stack_fffffffffffffed0 <
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)(sVar3 - 1)) {
      std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                 in_stack_fffffffffffffec0);
      in_stack_fffffffffffffec8 =
           std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                     ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                      in_stack_fffffffffffffec0);
      in_stack_fffffffffffffec0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffeb8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffeb8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator+((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffec8,(difference_type)in_stack_fffffffffffffec0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator+((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffec8,(difference_type)in_stack_fffffffffffffec0);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      assign<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffed0,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      pvVar4 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                         ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                          in_stack_fffffffffffffec0);
      ::std::__cxx11::string::operator=((string *)&pvVar4->name,"++");
      local_c0 = (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                 ((long)&(local_c0->
                         super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
LAB_00183b0b:
  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)in_stack_fffffffffffffec0)
  ;
  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)in_stack_fffffffffffffec0)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffed0,&in_stack_fffffffffffffec8->parents);
  pvVar4 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                     ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                      in_stack_fffffffffffffec0);
  ::std::__cxx11::string::operator=((string *)&pvVar4->name,"++");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffed0);
  ::std::__cxx11::string::~string((string *)(local_50 + 0x18));
  return;
}

Assistant:

CLI11_INLINE void
checkParentSegments(std::vector<ConfigItem> &output, const std::string &currentSection, char parentSeparator) {

    std::string estring;
    auto parents = detail::generate_parents(currentSection, estring, parentSeparator);
    if(!output.empty() && output.back().name == "--") {
        std::size_t msize = (parents.size() > 1U) ? parents.size() : 2;
        while(output.back().parents.size() >= msize) {
            output.push_back(output.back());
            output.back().parents.pop_back();
        }

        if(parents.size() > 1) {
            std::size_t common = 0;
            std::size_t mpair = (std::min)(output.back().parents.size(), parents.size() - 1);
            for(std::size_t ii = 0; ii < mpair; ++ii) {
                if(output.back().parents[ii] != parents[ii]) {
                    break;
                }
                ++common;
            }
            if(common == mpair) {
                output.pop_back();
            } else {
                while(output.back().parents.size() > common + 1) {
                    output.push_back(output.back());
                    output.back().parents.pop_back();
                }
            }
            for(std::size_t ii = common; ii < parents.size() - 1; ++ii) {
                output.emplace_back();
                output.back().parents.assign(parents.begin(), parents.begin() + static_cast<std::ptrdiff_t>(ii) + 1);
                output.back().name = "++";
            }
        }
    } else if(parents.size() > 1) {
        for(std::size_t ii = 0; ii < parents.size() - 1; ++ii) {
            output.emplace_back();
            output.back().parents.assign(parents.begin(), parents.begin() + static_cast<std::ptrdiff_t>(ii) + 1);
            output.back().name = "++";
        }
    }

    // insert a section end which is just an empty items_buffer
    output.emplace_back();
    output.back().parents = std::move(parents);
    output.back().name = "++";
}